

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::Hardware::reset(Hardware *this)

{
  uchar *puVar1;
  _Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> __f;
  _Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> __f_00;
  _Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  *p_Var2;
  _Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  *p_Var3;
  _Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel> *p_Var4;
  undefined1 in_stack_ffffffffffffffd8 [12];
  value_type in_stack_ffffffffffffffe4;
  
  __f.super__Mem_fn_base<void_(trackerboy::apu::LengthCounter::*)()_noexcept,_true>._12_4_ =
       in_stack_ffffffffffffffe4;
  __f.super__Mem_fn_base<void_(trackerboy::apu::LengthCounter::*)()_noexcept,_true>._0_12_ =
       in_stack_ffffffffffffffd8;
  std::
  for_each<trackerboy::apu::LengthCounter*,std::_Mem_fn<void(trackerboy::apu::LengthCounter::*)()noexcept>>
            ((_Mem_fn<void_(trackerboy::apu::LengthCounter::*)()_noexcept> *)this,
             (LengthCounter *)&this->mEnvelopes,(LengthCounter *)LengthCounter::reset,__f);
  __f_00.super__Mem_fn_base<void_(trackerboy::apu::Envelope::*)()_noexcept,_true>._12_4_ =
       in_stack_ffffffffffffffe4;
  __f_00.super__Mem_fn_base<void_(trackerboy::apu::Envelope::*)()_noexcept,_true>._0_12_ =
       in_stack_ffffffffffffffd8;
  std::
  for_each<trackerboy::apu::Envelope*,std::_Mem_fn<void(trackerboy::apu::Envelope::*)()noexcept>>
            ((_Mem_fn<void_(trackerboy::apu::Envelope::*)()_noexcept> *)&this->mEnvelopes,
             (Envelope *)&this->field_0x3f,(Envelope *)Envelope::reset,__f_00);
  (this->mSweep).mShadow = 0;
  (this->mSweep).mSubtraction = false;
  (this->mSweep).mTime = '\0';
  (this->mSweep).mShift = '\0';
  (this->mSweep).mCounter = '\0';
  (this->mSweep).mRegister = '\0';
  (this->mSequencer).mTimer.mCounter = 0x4000;
  (this->mSequencer).mTimer.mPeriod = 0x4000;
  (this->mSequencer).mTriggerIndex = 0;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mTimer.
  mPeriod = 0x2000;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyCounter = 0;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDuty = '\x03';
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyWaveform = '~';
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mEnabled =
       false;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.
           mTimer + 4) = 0x2000;
  *(undefined8 *)
   &(this->mChannels).
    super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .
    super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyCounter = 0;
  p_Var2 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var2->
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ).super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDuty = '\x03';
  (p_Var2->
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ).super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyWaveform = '~';
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mEnabled =
       false;
  p_Var3 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mFrequency = 0;
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mOutput = '\0';
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mDacOn = false;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.super_Channel +
   0xc) = 0x1000;
  *(bool *)((long)&(this->mChannels).
                   super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.
                   super_Channel + 4) = false;
  p_Var4 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>;
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mFrequency = 0;
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mOutput = '\0';
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mDacOn = false;
  puVar1 = (uchar *)((long)&(this->mChannels).
                            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl
                            .mWaveram + 0xc);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  p_Var3 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveVolume = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mVolumeShift = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveIndex = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mSampleBuffer = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[0] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[1] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[2] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[3] =
       '\0';
  puVar1 = (uchar *)((long)&(this->mChannels).
                            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl
                            .mWaveram + 4);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(undefined4 *)
   &(this->mChannels).
    super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .
    super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
    super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
    super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl.super_Channel = 0;
  *(bool *)((long)&(this->mChannels).
                   super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
                   super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 4) =
       false;
  *(undefined4 *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
           super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 0x18) =
       0x7fff0001;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
           super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 0xc) = 8;
  std::array<trackerboy::apu::MixMode,_4UL>::fill
            (&this->mMix,(value_type *)&stack0xffffffffffffffe4);
  *(undefined4 *)(this->mLastOutputs)._M_elems = 0;
  return;
}

Assistant:

void Hardware::reset() {
    std::for_each(mLengthCounters.begin(), mLengthCounters.end(), std::mem_fn(&LengthCounter::reset));
    std::for_each(mEnvelopes.begin(), mEnvelopes.end(), std::mem_fn(&Envelope::reset));
    mSweep.reset();
    mSequencer.reset();
    std::get<0>(mChannels).reset();
    std::get<1>(mChannels).reset();
    std::get<2>(mChannels).reset();
    std::get<3>(mChannels).reset();

    mMix.fill(MixMode::mute);
    mLastOutputs.fill((uint8_t)0);
}